

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O2

size_t google::protobuf::internal::StringBlock::Delete(StringBlock *block)

{
  size_t sVar1;
  LogMessageFatal LStack_18;
  
  if (block != (StringBlock *)0x0) {
    if (block->heap_allocated_ == true) {
      sVar1 = (size_t)block->allocated_size_;
      operator_delete(block,sVar1);
    }
    else {
      sVar1 = 0;
    }
    return sVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
             ,0x93,"block != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline size_t StringBlock::Delete(StringBlock* block) {
  ABSL_DCHECK(block != nullptr);
  if (!block->heap_allocated_) return size_t{0};
  size_t size = block->allocated_size();
  internal::SizedDelete(block, size);
  return size;
}